

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

Vec_Int_t * Abc_NtkCollectCoCones(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *vArr;
  Vec_Int_t *pVVar5;
  int *piVar6;
  uint *__ptr;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  timespec ts;
  timespec local_78;
  long local_68;
  int local_5c;
  Abc_Ntk_t *local_58;
  Vec_Ptr_t *local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  void *local_38;
  
  iVar3 = clock_gettime(3,&local_78);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_68 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  piVar6 = (int *)0x0;
  local_5c = fVerbose;
  pVVar4 = Abc_NtkDfs(pNtk,0);
  vArr = (Vec_Int_t *)malloc(0x10);
  vArr->nCap = 0;
  vArr->nSize = 0;
  vArr->pArray = (int *)0x0;
  iVar3 = pNtk->vCos->nSize;
  local_58 = pNtk;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar8 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 != 0) {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar5->pArray = piVar6;
  uVar1 = local_58->vObjs->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar1 - 1) {
    uVar9 = uVar1;
  }
  __ptr[1] = 0;
  *__ptr = uVar9;
  local_48 = (ulong)uVar1;
  local_40 = pVVar5;
  if (uVar9 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)(int)uVar9,0x10);
  }
  *(void **)(__ptr + 2) = pvVar7;
  __ptr[1] = (uint)local_48;
  local_50 = pVVar4;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    local_38 = pvVar7;
    do {
      pvVar7 = local_50->pArray[lVar10];
      iVar3 = *(int *)((long)pvVar7 + 0x10);
      if (((long)iVar3 < 0) || ((int)local_48 <= iVar3)) goto LAB_002edcad;
      pVVar5 = (Vec_Int_t *)((long)iVar3 * 0x10 + (long)local_38);
      if (0 < *(int *)((long)pvVar7 + 0x1c)) {
        lVar11 = 0;
        do {
          iVar3 = *(int *)(*(long *)((long)pvVar7 + 0x20) + lVar11 * 4);
          if (((long)iVar3 < 0) || ((int)__ptr[1] <= iVar3)) goto LAB_002edcad;
          Vec_IntTwoMerge2(pVVar5,(Vec_Int_t *)((long)iVar3 * 0x10 + *(long *)(__ptr + 2)),vArr);
          local_78.tv_sec._0_4_ = pVVar5->nCap;
          local_78.tv_sec._4_4_ = pVVar5->nSize;
          local_78.tv_nsec = (long)pVVar5->pArray;
          iVar3 = vArr->nSize;
          piVar6 = vArr->pArray;
          pVVar5->nCap = vArr->nCap;
          pVVar5->nSize = iVar3;
          pVVar5->pArray = piVar6;
          vArr->nCap = (undefined4)local_78.tv_sec;
          vArr->nSize = local_78.tv_sec._4_4_;
          vArr->pArray = (int *)local_78.tv_nsec;
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)pvVar7 + 0x1c));
      }
      Vec_IntPush(pVVar5,(int)lVar10);
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_50->nSize);
  }
  pVVar5 = local_40;
  pAVar2 = local_58;
  pVVar4 = local_58->vCos;
  if (0 < pVVar4->nSize) {
    lVar10 = 0;
    do {
      iVar3 = **(int **)((long)pVVar4->pArray[lVar10] + 0x20);
      if (((long)iVar3 < 0) || ((int)__ptr[1] <= iVar3)) {
LAB_002edcad:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      Vec_IntPush(pVVar5,*(int *)(*(long *)(__ptr + 2) + 4 + (long)iVar3 * 0x10));
      lVar10 = lVar10 + 1;
      pVVar4 = pAVar2->vCos;
    } while (lVar10 < pVVar4->nSize);
  }
  uVar1 = *__ptr;
  if (0 < (long)(int)uVar1) {
    lVar10 = *(long *)(__ptr + 2);
    lVar11 = 0;
    do {
      pvVar7 = *(void **)(lVar10 + 8 + lVar11);
      if (pvVar7 != (void *)0x0) {
        free(pvVar7);
        *(undefined8 *)(lVar10 + 8 + lVar11) = 0;
      }
      lVar11 = lVar11 + 0x10;
    } while ((long)(int)uVar1 * 0x10 != lVar11);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  __ptr[0] = 0;
  __ptr[1] = 0;
  free(__ptr);
  pVVar4 = local_50;
  iVar3 = local_5c;
  if (local_50->pArray != (void **)0x0) {
    free(local_50->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  if (vArr->pArray != (int *)0x0) {
    free(vArr->pArray);
    vArr->pArray = (int *)0x0;
  }
  free(vArr);
  if (iVar3 != 0) {
    iVar8 = 3;
    iVar3 = clock_gettime(3,&local_78);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    lVar10 = lVar10 + local_68;
    Abc_Print(iVar8,"%s =","Input  cone computation");
    Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)lVar10 / 1000000.0,0));
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCoCones( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCo = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanout, vFanin, vTemp ); 
            ABC_SWAP( Vec_Int_t, *vFanout, *vTemp );
        }
        Vec_IntPush( vFanout, i );
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
        Vec_IntPush( vSuppsCo, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Input  cone computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCo );
    return vSuppsCo;
}